

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  RemoveConst<kj::HttpHeaders::Header> **params;
  char cVar1;
  Header *pHVar2;
  RemoveConst<kj::HttpHeaders::Header> *pRVar3;
  _Hash_node_base *p_Var4;
  PromiseArena *pPVar5;
  SourceLocation location;
  StringPtr **ppSVar6;
  OwnPromiseNode OVar7;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar8;
  void *pvVar9;
  Own<kj::AsyncInputStream,_std::nullptr_t> *pOVar10;
  void *__child_stack;
  undefined4 in_register_00000034;
  HttpHeaders *pHVar11;
  undefined4 in_register_00000084;
  __fn *in_R9;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:7054:26)>
  *location_00;
  TransformPromiseNodeBase *this_00;
  Own<kj::AsyncInputStream,_std::nullptr_t> OVar12;
  char *in_stack_00000008;
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  OneWayPipe pipe;
  String statusTextCopy;
  OwnPromiseNode local_148;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_140;
  Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t> local_138
  ;
  undefined1 local_128 [16];
  RemoveConst<kj::HttpHeaders::Header> *local_118;
  HttpHeaders *pHStack_110;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_108;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_100;
  OneWayPipe local_f8;
  Array<char> local_d8;
  undefined1 local_b8 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_90;
  HttpHeaders *pHStack_88;
  bool local_80;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_78;
  Maybe<unsigned_long> local_50;
  size_t local_40;
  undefined8 local_38;
  
  pHVar11 = (HttpHeaders *)CONCAT44(in_register_00000034,__fd);
  local_38 = CONCAT44(in_register_00000084,__flags);
  local_40 = __n;
  str<kj::StringPtr&>((String *)&local_d8,(kj *)&local_40,(StringPtr *)__buf);
  HttpHeaders::clone((HttpHeaders *)local_b8,in_R9,__child_stack,(int)__n,
                     (void *)CONCAT44(in_register_00000084,__flags));
  heap<kj::HttpHeaders>((kj *)&local_118,(HttpHeaders *)local_b8);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_b8);
  cVar1 = *in_stack_00000008;
  aVar8 = local_50.ptr.field_1;
  if ((cVar1 == '\x01') &&
     (aVar8.value = ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                    (in_stack_00000008 + 8))->value,
     ((anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)(in_stack_00000008 + 8))->value
     == 0)) {
    params = &(pHVar11->unindexedHeaders).builder.pos;
    local_b8._8_4_ = (int)__buf;
    local_b8._16_8_ = local_d8.ptr;
    local_b8._24_8_ = local_d8.size_;
    local_b8._32_8_ = local_d8.disposer;
    local_90 = local_118;
    pHStack_88 = pHStack_110;
    pHStack_110 = (HttpHeaders *)0x0;
    local_78.value = 0;
    local_d8.ptr = (char *)0x0;
    local_d8.size_ = 0;
    local_f8.in.disposer =
         (Disposer *)
         kj::_::
         SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:7054:26)>
         ::anon_class_72_5_009bee8d_for_func::operator();
    pRVar3 = (pHVar11->unindexedHeaders).builder.pos;
    p_Var4 = (_Hash_node_base *)
             (((unordered_map<kj::StringPtr,_unsigned_int,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>_>
                *)&pRVar3->name)->_M_h)._M_bucket_count;
    local_b8._0_8_ = pHVar11;
    local_80 = (bool)cVar1;
    if (p_Var4 == (_Hash_node_base *)0x0 || (ulong)((long)pRVar3 - (long)p_Var4) < 0x68) {
      pvVar9 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:7054:26)>
                     *)((long)pvVar9 + 0x398);
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,
                 (anon_class_72_5_009bee8d_for_func *)local_b8,(void **)&local_f8);
      *(void **)((long)pvVar9 + 0x3a0) = pvVar9;
    }
    else {
      (((unordered_map<kj::StringPtr,_unsigned_int,_kj::(anonymous_namespace)::HeaderNameHash,_kj::(anonymous_namespace)::HeaderNameHash,_std::allocator<std::pair<const_kj::StringPtr,_unsigned_int>_>_>
         *)&pRVar3->name)->_M_h)._M_bucket_count = 0;
      location_00 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:7054:26)>
                     *)&pRVar3[-4].value.content.size_;
      ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_,void*&>
                (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,
                 (anon_class_72_5_009bee8d_for_func *)local_b8,(void **)&local_f8);
      pRVar3[-3].name.content.ptr = (char *)p_Var4;
    }
    local_128._0_8_ = (PromiseNode *)0x0;
    local_138.disposer = (Disposer *)0x0;
    local_148.ptr = (PromiseNode *)location_00;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_128);
    OVar7.ptr = local_148.ptr;
    local_f8.in.disposer = (Disposer *)0x4d3fd6;
    local_f8.in.ptr = (AsyncInputStream *)&DAT_004a5b74;
    local_f8.out.disposer = (Disposer *)0x1000001b8e;
    pPVar5 = (((TransformPromiseNodeBase *)&(local_148.ptr)->super_PromiseArenaMember)->
             super_PromiseNode).super_PromiseArenaMember.arena;
    if (pPVar5 == (PromiseArena *)0x0 || (ulong)((long)local_148.ptr - (long)pPVar5) < 0x28) {
      pvVar9 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_148,kj::_::IdentityFunc<void>::operator());
      *(undefined ***)((long)pvVar9 + 0x3d8) = &PTR_destroy_0066fb28;
      *(void **)((long)pvVar9 + 0x3e0) = pvVar9;
    }
    else {
      (((TransformPromiseNodeBase *)&(local_148.ptr)->super_PromiseArenaMember)->super_PromiseNode).
      super_PromiseArenaMember.arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)((long)(local_148.ptr + -3) + 8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,&local_148,kj::_::IdentityFunc<void>::operator());
      *(undefined ***)((long)(OVar7.ptr + -3) + 8) = &PTR_destroy_0066fb28;
      ((Own<kj::HttpHeaders,_std::nullptr_t> *)(OVar7.ptr + -2))->disposer = (Disposer *)pPVar5;
    }
    local_128._0_8_ = (HttpHeaderTable *)0x0;
    local_138.disposer = (Disposer *)0x0;
    local_100.ptr = &this_00->super_PromiseNode;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_138);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)local_128);
    location.function = (char *)local_f8.in.ptr;
    location.fileName = (char *)local_f8.in.disposer;
    location._16_8_ = local_f8.out.disposer;
    kj::_::spark<kj::_::Void>(&local_140,location);
    local_108.ptr = local_140.ptr;
    local_140.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_100);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)params,&local_108);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_108);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_148);
    (anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::
    send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1}::
    ~Maybe((_lambda___1_ *)local_b8);
    heap<kj::NullStream>();
    (this->super_Response)._vptr_Response = (_func_int **)local_b8._0_8_;
    pOVar10 = (Own<kj::AsyncInputStream,_std::nullptr_t> *)(local_b8._8_8_ + 8);
    if ((DelayedEofInputStream *)local_b8._8_8_ == (DelayedEofInputStream *)0x0) {
      pOVar10 = (Own<kj::AsyncInputStream,_std::nullptr_t> *)0x0;
    }
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pOVar10;
    local_b8._8_8_ = (DelayedEofInputStream *)0x0;
    Own<kj::NullStream,_std::nullptr_t>::dispose((Own<kj::NullStream,_std::nullptr_t> *)local_b8);
  }
  else {
    local_50.ptr.field_1 = aVar8;
    local_50.ptr.isSet = (bool)cVar1;
    newOneWayPipe(&local_f8,&local_50);
    ppSVar6 = (StringPtr **)&(pHVar11->indexedHeaders).size_;
    *(int *)ppSVar6 = *(int *)ppSVar6 + 1;
    local_138.disposer = (Disposer *)&pHVar11->indexedHeaders;
    local_138.ptr = (WebSocketResponseImpl *)pHVar11;
    Promise<void>::
    attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
              ((Promise<void> *)&local_140,
               (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
                *)&(pHVar11->unindexedHeaders).builder.pos);
    heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::Promise<void>>
              ((kj *)local_b8,&local_f8.in,(Promise<void> *)&local_140);
    local_128._0_8_ = local_b8._0_8_;
    local_128._8_8_ = local_b8._8_8_;
    local_b8._8_8_ = (DelayedEofInputStream *)0x0;
    Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,_std::nullptr_t>
                *)local_b8);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140);
    Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>::~Own
              (&local_138);
    pHVar2 = (pHVar11->unindexedHeaders).builder.ptr;
    local_b8._0_4_ = (int)__buf;
    local_b8._8_8_ = local_d8.ptr;
    if ((HttpHeaders *)local_d8.size_ == (HttpHeaders *)0x0) {
      local_b8._8_8_ = (DelayedEofInputStream *)0x4706a1;
    }
    local_b8._16_8_ =
         (long)&(((Vector<kj::StringPtr> *)local_d8.size_)->builder).ptr +
         (ulong)((HttpHeaders *)local_d8.size_ == (HttpHeaders *)0x0);
    local_b8._24_8_ = pHStack_110;
    OVar12 = Own<kj::AsyncInputStream,decltype(nullptr)>::
             attach<kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
                       ((Own<kj::AsyncInputStream,decltype(nullptr)> *)&local_138,
                        (String *)local_128,(Own<kj::HttpHeaders,_std::nullptr_t> *)&local_d8);
    local_b8._32_4_ = 1;
    local_90 = (RemoveConst<kj::HttpHeaders::Header> *)local_138.disposer;
    pHStack_88 = (HttpHeaders *)local_138.ptr;
    local_138.ptr = (WebSocketResponseImpl *)0x0;
    (**(_func_int **)((long)(pHVar2->name).content.ptr + 0x10))(pHVar2,local_b8,OVar12.ptr);
    OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>::
    ~OneOf((OneOf<kj::Own<kj::AsyncInputStream,_std::nullptr_t>,_kj::Own<kj::WebSocket,_std::nullptr_t>_>
            *)(local_b8 + 0x20));
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)&local_138);
    (this->super_Response)._vptr_Response = (_func_int **)local_f8.out.disposer;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_f8.out.ptr;
    local_f8.out.ptr = (AsyncOutputStream *)0x0;
    Own<kj::AsyncInputStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_128);
    OneWayPipe::~OneWayPipe(&local_f8);
  }
  if (pHStack_110 != (HttpHeaders *)0x0) {
    pHStack_110 = (HttpHeaders *)0x0;
    (*(code *)(((RemoveConst<kj::StringPtr> *)(local_118->name).content.ptr)->content).ptr)();
  }
  Array<char>::~Array(&local_d8);
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<HeadResponseStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<kj::NullStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }